

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# has_bits_test.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::HasBits_ValueInit_Test::TestBody
          (HasBits_ValueInit_Test *this)

{
  initializer_list<unsigned_int> has_bits;
  initializer_list<unsigned_int> has_bits_00;
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_290;
  Message local_288;
  ComparisonBase<testing::internal::EqMatcher<int>,_int,_std::equal_to<void>_> local_280;
  EqMatcher<int> local_27c;
  undefined1 local_278 [8];
  AssertionResult gtest_ar_4;
  Message local_260;
  ComparisonBase<testing::internal::EqMatcher<int>,_int,_std::equal_to<void>_> local_258;
  EqMatcher<int> local_254;
  undefined1 local_250 [8];
  AssertionResult gtest_ar_3;
  Message local_238;
  ComparisonBase<testing::internal::EqMatcher<int>,_int,_std::equal_to<void>_> local_230;
  EqMatcher<int> local_22c;
  undefined1 local_228 [8];
  AssertionResult gtest_ar_2;
  Message local_210;
  ComparisonBase<testing::internal::EqMatcher<int>,_int,_std::equal_to<void>_> local_208;
  EqMatcher<int> local_204;
  undefined1 local_200 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_1d0;
  Message local_1c8;
  bool local_1b9;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar__3;
  undefined1 local_188 [8];
  HasBits<4> bits_3;
  Message local_170;
  ComparisonBase<testing::internal::EqMatcher<int>,_int,_std::equal_to<void>_> local_168;
  EqMatcher<int> local_164;
  undefined1 local_160 [8];
  AssertionResult gtest_ar;
  AssertHelper local_130;
  Message local_128;
  bool local_119;
  undefined1 local_118 [8];
  AssertionResult gtest_ar__2;
  undefined1 local_f0 [8];
  HasBits<4> bits_2;
  AssertHelper local_c0;
  Message local_b8;
  bool local_a9;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar__1;
  undefined1 local_88 [8];
  HasBits<4> bits_1;
  AssertHelper local_58 [3];
  Message local_40;
  bool local_31;
  undefined1 local_30 [8];
  AssertionResult gtest_ar_;
  HasBits<4> bits;
  HasBits_ValueInit_Test *this_local;
  
  HasBits<4>::HasBits((HasBits<4> *)&gtest_ar_.message_);
  local_31 = HasBits<4>::empty((HasBits<4> *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_30,&local_31,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)(bits_1.has_bits_ + 2),(internal *)local_30,
               (AssertionResult *)"bits.empty()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/has_bits_test.cc"
               ,0x27,pcVar2);
    testing::internal::AssertHelper::operator=(local_58,&local_40);
    testing::internal::AssertHelper::~AssertHelper(local_58);
    std::__cxx11::string::~string((string *)(bits_1.has_bits_ + 2));
    testing::Message::~Message(&local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  std::initializer_list<unsigned_int>::initializer_list
            ((initializer_list<unsigned_int> *)&gtest_ar__1.message_);
  HasBits<4>::HasBits((HasBits<4> *)local_88,stack0xffffffffffffff68);
  local_a9 = HasBits<4>::empty((HasBits<4> *)local_88);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_a8,&local_a9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)(bits_2.has_bits_ + 2),(internal *)local_a8,
               (AssertionResult *)"bits.empty()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/has_bits_test.cc"
               ,0x2b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    std::__cxx11::string::~string((string *)(bits_2.has_bits_ + 2));
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 1;
  has_bits_00._M_len = 1;
  has_bits_00._M_array =
       (iterator)
       ((long)&gtest_ar__2.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       + 4);
  HasBits<4>::HasBits((HasBits<4> *)local_f0,has_bits_00);
  bVar1 = HasBits<4>::empty((HasBits<4> *)local_f0);
  local_119 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_118,&local_119,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_118,(AssertionResult *)"bits.empty()",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/has_bits_test.cc"
               ,0x2f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_130,&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  local_168.rhs_ = (int)testing::Eq<int>(1);
  local_164.super_ComparisonBase<testing::internal::EqMatcher<int>,_int,_std::equal_to<void>_>.rhs_
       = (ComparisonBase<testing::internal::EqMatcher<int>,_int,_std::equal_to<void>_>)
         testing::internal::MakePredicateFormatterFromMatcher<testing::internal::EqMatcher<int>>
                   ((EqMatcher<int>)local_168.rhs_);
  HasBits<4>::operator[]((HasBits<4> *)local_f0,0);
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<int>>::operator()
            (local_160,(char *)&local_164,(uint *)"bits[0]");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(bits_3.has_bits_ + 2),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/has_bits_test.cc"
               ,0x30,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)(bits_3.has_bits_ + 2),&local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(bits_3.has_bits_ + 2));
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  gtest_ar__3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 1;
  gtest_ar__3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 2;
  has_bits._M_len = 4;
  has_bits._M_array = (iterator)&gtest_ar__3.message_;
  HasBits<4>::HasBits((HasBits<4> *)local_188,has_bits);
  bVar1 = HasBits<4>::empty((HasBits<4> *)local_188);
  local_1b9 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1b8,&local_1b9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar1) {
    testing::Message::Message(&local_1c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_1b8,
               (AssertionResult *)"bits.empty()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/has_bits_test.cc"
               ,0x34,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  local_208.rhs_ = (int)testing::Eq<int>(1);
  local_204.super_ComparisonBase<testing::internal::EqMatcher<int>,_int,_std::equal_to<void>_>.rhs_
       = (ComparisonBase<testing::internal::EqMatcher<int>,_int,_std::equal_to<void>_>)
         testing::internal::MakePredicateFormatterFromMatcher<testing::internal::EqMatcher<int>>
                   ((EqMatcher<int>)local_208.rhs_);
  HasBits<4>::operator[]((HasBits<4> *)local_188,0);
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<int>>::operator()
            (local_200,(char *)&local_204,(uint *)"bits[0]");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
  if (!bVar1) {
    testing::Message::Message(&local_210);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_200);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/has_bits_test.cc"
               ,0x35,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_210);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
  local_230.rhs_ = (int)testing::Eq<int>(2);
  local_22c.super_ComparisonBase<testing::internal::EqMatcher<int>,_int,_std::equal_to<void>_>.rhs_
       = (ComparisonBase<testing::internal::EqMatcher<int>,_int,_std::equal_to<void>_>)
         testing::internal::MakePredicateFormatterFromMatcher<testing::internal::EqMatcher<int>>
                   ((EqMatcher<int>)local_230.rhs_);
  HasBits<4>::operator[]((HasBits<4> *)local_188,1);
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<int>>::operator()
            (local_228,(char *)&local_22c,(uint *)"bits[1]");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
  if (!bVar1) {
    testing::Message::Message(&local_238);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/has_bits_test.cc"
               ,0x36,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
  local_258.rhs_ = (int)testing::Eq<int>(3);
  local_254.super_ComparisonBase<testing::internal::EqMatcher<int>,_int,_std::equal_to<void>_>.rhs_
       = (ComparisonBase<testing::internal::EqMatcher<int>,_int,_std::equal_to<void>_>)
         testing::internal::MakePredicateFormatterFromMatcher<testing::internal::EqMatcher<int>>
                   ((EqMatcher<int>)local_258.rhs_);
  HasBits<4>::operator[]((HasBits<4> *)local_188,2);
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<int>>::operator()
            (local_250,(char *)&local_254,(uint *)"bits[2]");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
  if (!bVar1) {
    testing::Message::Message(&local_260);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_250);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/has_bits_test.cc"
               ,0x37,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_260);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_260);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
  local_280.rhs_ = (int)testing::Eq<int>(4);
  local_27c.super_ComparisonBase<testing::internal::EqMatcher<int>,_int,_std::equal_to<void>_>.rhs_
       = (ComparisonBase<testing::internal::EqMatcher<int>,_int,_std::equal_to<void>_>)
         testing::internal::MakePredicateFormatterFromMatcher<testing::internal::EqMatcher<int>>
                   ((EqMatcher<int>)local_280.rhs_);
  HasBits<4>::operator[]((HasBits<4> *)local_188,3);
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<int>>::operator()
            (local_278,(char *)&local_27c,(uint *)"bits[3]");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
  if (!bVar1) {
    testing::Message::Message(&local_288);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_278);
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/has_bits_test.cc"
               ,0x38,pcVar2);
    testing::internal::AssertHelper::operator=(&local_290,&local_288);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    testing::Message::~Message(&local_288);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
  return;
}

Assistant:

TEST(HasBits, ValueInit) {
  {
    HasBits<4> bits;
    EXPECT_TRUE(bits.empty());
  }
  {
    HasBits<4> bits({});
    EXPECT_TRUE(bits.empty());
  }
  {
    HasBits<4> bits({1});
    EXPECT_FALSE(bits.empty());
    EXPECT_THAT(bits[0], Eq(1));
  }
  {
    HasBits<4> bits({1, 2, 3, 4});
    EXPECT_FALSE(bits.empty());
    EXPECT_THAT(bits[0], Eq(1));
    EXPECT_THAT(bits[1], Eq(2));
    EXPECT_THAT(bits[2], Eq(3));
    EXPECT_THAT(bits[3], Eq(4));
  }
}